

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int8_t sixbit_from_b64(base64_maps_t *maps,uchar b64letter)

{
  char cVar1;
  int *piVar2;
  undefined3 in_register_00000031;
  
  cVar1 = maps->decode_map[CONCAT31(in_register_00000031,b64letter)];
  if (cVar1 == -1) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
  }
  return cVar1;
}

Assistant:

static int8_t sixbit_from_b64(const base64_maps_t *maps,
			      const unsigned char b64letter)
{
	int8_t ret;

	ret = maps->decode_map[(unsigned char)b64letter];
	if (ret == (char)0xff) {
		errno = EDOM;
		return -1;
	}

	return ret;
}